

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lys_type * lyd_leaf_type(lyd_node_leaf_list *leaf)

{
  int iVar1;
  lyd_node_leaf_list *local_20;
  lys_type *type;
  lyd_node_leaf_list *leaf_local;
  
  if ((leaf == (lyd_node_leaf_list *)0x0) ||
     ((leaf->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN)) {
    leaf_local = (lyd_node_leaf_list *)0x0;
  }
  else {
    local_20 = (lyd_node_leaf_list *)&leaf->schema[1].ref;
    type = (lys_type *)leaf;
    do {
      if (*(LY_DATA_TYPE *)&local_20->validity == LY_TYPE_LEAFREF) {
        local_20 = (lyd_node_leaf_list *)(local_20->value_str + 0x78);
      }
      else if (*(LY_DATA_TYPE *)&local_20->validity == LY_TYPE_UNION) {
        if ((*(int *)((long)&local_20->value_str + 4) != 0) && ((char)type->base != LY_TYPE_DER)) {
          return (lys_type *)0x0;
        }
        iVar1 = resolve_union((lyd_node_leaf_list *)type,(lys_type *)local_20,0,0,
                              (lys_type **)&local_20);
        if (iVar1 != 0) {
          return (lys_type *)0x0;
        }
      }
    } while (*(LY_DATA_TYPE *)&local_20->validity == LY_TYPE_LEAFREF);
    leaf_local = local_20;
  }
  return (lys_type *)leaf_local;
}

Assistant:

lys_type *
lyd_leaf_type(const struct lyd_node_leaf_list *leaf)
{
    struct lys_type *type;

    if (!leaf || !(leaf->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
        return NULL;
    }

    type = &((struct lys_node_leaf *)leaf->schema)->type;

    do {
        if (type->base == LY_TYPE_LEAFREF) {
            type = &type->info.lref.target->type;
        } else if (type->base == LY_TYPE_UNION) {
            if (type->info.uni.has_ptr_type && leaf->validity) {
                /* we don't know what it will be after resolution (validation) */
                return NULL;
            }

            if (resolve_union((struct lyd_node_leaf_list *)leaf, type, 0, 0, &type)) {
                /* resolve union failed */
                return NULL;
            }
        }
    } while (type->base == LY_TYPE_LEAFREF);

    return type;
}